

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O2

void __thiscall YdiskRestClient::makeFolder(YdiskRestClient *this,string *utf8Path)

{
  undefined8 extraout_RAX;
  char *this_00;
  Client *this_01;
  string empty_body;
  shared_ptr<httplib::Response> r;
  string url;
  string local_60;
  undefined1 local_40 [16];
  Headers *local_30;
  
  this_00 = "/v1/disk/resources?path=";
  std::__cxx11::string::string
            ((string *)&local_30,"/v1/disk/resources?path=",(allocator *)&local_60);
  url_encode(&local_60,(YdiskRestClient *)this_00,utf8Path);
  std::__cxx11::string::append((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_60);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  this_01 = (Client *)local_40;
  httplib::Client::Put
            (this_01,(char *)this->http_client,local_30,(string *)&this->headers,(char *)&local_60);
  if (((Response *)local_40._0_8_ != (Response *)0x0) && (*(int *)(local_40._0_8_ + 0x20) == 0xc9))
  {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_30);
    return;
  }
  throw_response_error((YdiskRestClient *)this_01,(Response *)local_40._0_8_);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_30);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void YdiskRestClient::makeFolder(std::string utf8Path)
{
    std::string url("/v1/disk/resources?path=");
    url += url_encode(utf8Path);
    std::string empty_body;
    auto r = http_client->Put(url.c_str(), headers, empty_body, "text/plain");

    if(!r.get() || r->status!=201)
        throw_response_error(r.get());
}